

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_>
          *rng)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  
  std::operator<<(sout,'[');
  piVar1 = (rng->base_).data_.
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Head_base<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
           ._M_head_impl._M_current;
  uVar2 = (long)(rng->base_).data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_head_impl._M_current - (long)piVar1 >> 2;
  if ((ulong)rng->count_ < uVar2) {
    uVar2 = rng->count_;
  }
  if (uVar2 != 0) {
    lVar3 = 0;
    while( true ) {
      std::ostream::operator<<((ostream *)sout,*(int *)((long)piVar1 + lVar3));
      if (uVar2 * 4 + -4 == lVar3) break;
      std::operator<<(sout,',');
      lVar3 = lVar3 + 4;
    }
  }
  std::operator<<(sout,']');
  return sout;
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }